

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O0

void __thiscall
Validator_resetNoTestVariable_Test::TestBody(Validator_resetNoTestVariable_Test *this)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  element_type *peVar6;
  char *pcVar7;
  AssertHelper local_218 [8];
  Message local_210 [8];
  shared_ptr<libcellml::Issue> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar_1;
  Message local_1c0 [8];
  unsigned_long local_1b8 [2];
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar;
  ValidatorPtr validator;
  string local_180 [39];
  allocator<char> local_159;
  string local_158 [39];
  allocator<char> local_131;
  string local_130 [39];
  allocator<char> local_109;
  string local_108 [39];
  allocator<char> local_e1;
  string local_e0 [39];
  allocator<char> local_b9;
  string local_b8 [32];
  undefined1 local_98 [8];
  ResetPtr r;
  VariablePtr v2;
  VariablePtr v1;
  ComponentPtr c;
  ModelPtr m;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string expectedError;
  Validator_resetNoTestVariable_Test *this_local;
  
  expectedError.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_30,
             "Reset in component \'comp\' with order \'4\', with variable \'var\', does not reference a test_variable."
             ,&local_31);
  std::allocator<char>::~allocator(&local_31);
  libcellml::Model::create();
  libcellml::Component::create();
  libcellml::Variable::create();
  libcellml::Variable::create();
  libcellml::Reset::create();
  peVar2 = std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_98);
  libcellml::Reset::setVariable((shared_ptr *)peVar2);
  peVar2 = std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_98);
  libcellml::Reset::setOrder((int)peVar2);
  peVar2 = std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_98);
  libcellml::Reset::setResetValue((string *)peVar2);
  peVar2 = std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_98);
  libcellml::Reset::setTestValue((string *)peVar2);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b8,"comp",&local_b9);
  libcellml::NamedEntity::setName((string *)peVar3);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  peVar4 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e0,"var",&local_e1);
  libcellml::NamedEntity::setName((string *)peVar4);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator(&local_e1);
  peVar4 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_108,"second",&local_109);
  libcellml::Variable::setUnits((string *)peVar4);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator(&local_109);
  peVar4 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&r.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_130,"var2",&local_131);
  libcellml::NamedEntity::setName((string *)peVar4);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator(&local_131);
  peVar4 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&r.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_158,"second",&local_159);
  libcellml::Variable::setUnits((string *)peVar4);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator(&local_159);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Component::addVariable((shared_ptr *)peVar3);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Component::addVariable((shared_ptr *)peVar3);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Component::addReset((shared_ptr *)peVar3);
  peVar5 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_180,"main",
             (allocator<char> *)
             ((long)&validator.super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::NamedEntity::setName((string *)peVar5);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&validator.super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  peVar5 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  libcellml::ComponentEntity::addComponent((shared_ptr *)peVar5);
  libcellml::Validator::create();
  peVar6 = std::__shared_ptr_access<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar.message_);
  libcellml::Validator::validateModel((shared_ptr *)peVar6);
  local_1b8[1] = 1;
  std::__shared_ptr_access<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar.message_);
  local_1b8[0] = libcellml::Logger::issueCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_1a8,"size_t(1)","validator->issueCount()",local_1b8 + 1,
             local_1b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
  if (!bVar1) {
    testing::Message::Message(local_1c0);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_1a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/validator/validator.cpp"
               ,0x502,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_1c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_1c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
  std::__shared_ptr_access<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar.message_);
  libcellml::Logger::issue((ulong)&local_208);
  std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_208);
  libcellml::Issue::description_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_1d8,"expectedError","validator->issue(0)->description()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
             &local_1f8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::shared_ptr<libcellml::Issue>::~shared_ptr(&local_208);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
  if (!bVar1) {
    testing::Message::Message(local_210);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
    testing::internal::AssertHelper::AssertHelper
              (local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/validator/validator.cpp"
               ,0x503,pcVar7);
    testing::internal::AssertHelper::operator=(local_218,local_210);
    testing::internal::AssertHelper::~AssertHelper(local_218);
    testing::Message::~Message(local_210);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
  std::shared_ptr<libcellml::Validator>::~shared_ptr
            ((shared_ptr<libcellml::Validator> *)&gtest_ar.message_);
  std::shared_ptr<libcellml::Reset>::~shared_ptr((shared_ptr<libcellml::Reset> *)local_98);
  std::shared_ptr<libcellml::Variable>::~shared_ptr
            ((shared_ptr<libcellml::Variable> *)
             &r.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Variable>::~shared_ptr
            ((shared_ptr<libcellml::Variable> *)
             &v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Component>::~shared_ptr
            ((shared_ptr<libcellml::Component> *)
             &v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Model>::~shared_ptr
            ((shared_ptr<libcellml::Model> *)
             &c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(Validator, resetNoTestVariable)
{
    const std::string expectedError =
        "Reset in component 'comp' with order '4', with variable 'var', does not reference a test_variable.";

    libcellml::ModelPtr m = libcellml::Model::create();
    libcellml::ComponentPtr c = libcellml::Component::create();
    libcellml::VariablePtr v1 = libcellml::Variable::create();
    libcellml::VariablePtr v2 = libcellml::Variable::create();
    libcellml::ResetPtr r = libcellml::Reset::create();

    // No test_variable
    r->setVariable(v1);
    r->setOrder(4);
    r->setResetValue(NON_EMPTY_MATH);
    r->setTestValue(NON_EMPTY_MATH);

    c->setName("comp");
    v1->setName("var");
    v1->setUnits("second");
    v2->setName("var2");
    v2->setUnits("second");

    c->addVariable(v1);
    c->addVariable(v2);

    c->addReset(r);

    m->setName("main");
    m->addComponent(c);

    libcellml::ValidatorPtr validator = libcellml::Validator::create();
    validator->validateModel(m);

    EXPECT_EQ(size_t(1), validator->issueCount());
    EXPECT_EQ(expectedError, validator->issue(0)->description());
}